

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endianness.hh
# Opt level: O2

bool __thiscall Typelib::EndianSwapVisitor::visit_(EndianSwapVisitor *this,Value *v,Pointer *t)

{
  UnsupportedEndianSwap *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (UnsupportedEndianSwap *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_38,"pointers",&local_39);
  UnsupportedEndianSwap::UnsupportedEndianSwap(this_00,&local_38);
  __cxa_throw(this_00,&UnsupportedEndianSwap::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool visit_ (Value const& v, Pointer const& t) { throw UnsupportedEndianSwap("pointers"); }